

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

BitReader * __thiscall
phosg::StringReader::sub_bits
          (BitReader *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  size_t size_local;
  size_t offset_local;
  StringReader *this_local;
  
  if (offset < this->length) {
    if (this->length < offset + size) {
      BitReader::BitReader(__return_storage_ptr__,this->data + offset,(this->length - offset) * 8,0)
      ;
    }
    else {
      BitReader::BitReader(__return_storage_ptr__,this->data + offset,size << 3,0);
    }
  }
  else {
    BitReader::BitReader(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BitReader StringReader::sub_bits(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return BitReader();
  }
  if (offset + size > this->length) {
    return BitReader(
        reinterpret_cast<const char*>(this->data) + offset,
        (this->length - offset) * 8);
  }
  return BitReader(reinterpret_cast<const char*>(this->data) + offset, size * 8);
}